

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
::split(btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
        *this,int insert_position,
       btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
       *dest,allocator_type *alloc)

{
  allocator_type *paVar1;
  uint uVar2;
  field_type fVar3;
  byte bVar4;
  byte bVar5;
  field_type fVar6;
  byte bVar7;
  bool bVar8;
  btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  *pbVar9;
  btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  *pbVar10;
  field_type *pfVar11;
  field_type local_32;
  byte local_31;
  field_type j;
  slot_type *psStack_30;
  field_type i;
  allocator_type *local_28;
  allocator_type *alloc_local;
  btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  *dest_local;
  btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  *pbStack_10;
  int insert_position_local;
  btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  *this_local;
  
  local_28 = alloc;
  alloc_local = (allocator_type *)dest;
  dest_local._4_4_ = insert_position;
  pbStack_10 = this;
  fVar3 = count(dest);
  if (fVar3 != '\0') {
    __assert_fail("dest->count() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x78e,
                  "void absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>]"
                 );
  }
  fVar3 = max_count(this);
  if (fVar3 != '\x1e') {
    __assert_fail("max_count() == kNodeSlots",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x78f,
                  "void absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>]"
                 );
  }
  bVar4 = position(this);
  bVar5 = position((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                    *)alloc_local);
  if (bVar4 + 1 != (uint)bVar5) {
    __assert_fail("position() + 1 == dest->position()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x790,
                  "void absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>]"
                 );
  }
  pbVar9 = parent(this);
  pbVar10 = parent((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                    *)alloc_local);
  uVar2 = dest_local._4_4_;
  if (pbVar9 != pbVar10) {
    __assert_fail("parent() == dest->parent()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x791,
                  "void absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>]"
                 );
  }
  bVar4 = start(this);
  paVar1 = alloc_local;
  if (uVar2 == bVar4) {
    fVar3 = start((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                   *)alloc_local);
    fVar6 = finish(this);
    set_finish((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                *)paVar1,fVar3 + fVar6 + 0xff);
  }
  else if (dest_local._4_4_ == 0x1e) {
    fVar3 = start((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                   *)alloc_local);
    set_finish((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                *)paVar1,fVar3);
  }
  else {
    fVar3 = start((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                   *)alloc_local);
    bVar4 = count(this);
    set_finish((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                *)paVar1,fVar3 + bVar4 / 2);
  }
  fVar3 = finish(this);
  fVar6 = count((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                 *)alloc_local);
  set_finish(this,fVar3 - fVar6);
  fVar3 = count(this);
  paVar1 = alloc_local;
  if (fVar3 == '\0') {
    __assert_fail("count() >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x79f,
                  "void absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>]"
                 );
  }
  bVar4 = count((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                 *)alloc_local);
  bVar5 = start((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                 *)alloc_local);
  bVar7 = finish(this);
  transfer_n((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
              *)paVar1,(ulong)bVar4,(ulong)bVar5,(ulong)bVar7,this,local_28);
  pfVar11 = mutable_finish(this);
  *pfVar11 = *pfVar11 + 0xff;
  pbVar9 = parent(this);
  fVar3 = position(this);
  paVar1 = local_28;
  psStack_30 = finish_slot(this);
  btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
  ::emplace_value<std::pair<int,int>*>
            ((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
              *)pbVar9,fVar3,paVar1,&stack0xffffffffffffffd0);
  fVar3 = finish(this);
  value_destroy(this,fVar3,local_28);
  pbVar9 = parent(this);
  fVar3 = position(this);
  set_child_noupdate_position
            (pbVar9,fVar3 + '\x01',
             (btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
              *)alloc_local);
  bVar8 = is_internal(this);
  if (bVar8) {
    local_31 = start((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                      *)alloc_local);
    local_32 = finish(this);
    while( true ) {
      local_32 = local_32 + '\x01';
      bVar4 = finish((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                      *)alloc_local);
      if (bVar4 < local_31) break;
      pbVar9 = child(this,local_32);
      paVar1 = alloc_local;
      if (pbVar9 == (btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                     *)0x0) {
        __assert_fail("child(j) != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                      ,0x7ad,
                      "void absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>]"
                     );
      }
      pbVar9 = child(this,local_32);
      init_child((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                  *)paVar1,local_31,pbVar9);
      clear_child(this,local_32);
      local_31 = local_31 + 1;
    }
  }
  return;
}

Assistant:

void btree_node<P>::split(const int insert_position, btree_node *dest,
                          allocator_type *alloc) {
  assert(dest->count() == 0);
  assert(max_count() == kNodeSlots);
  assert(position() + 1 == dest->position());
  assert(parent() == dest->parent());

  // We bias the split based on the position being inserted. If we're
  // inserting at the beginning of the left node then bias the split to put
  // more values on the right node. If we're inserting at the end of the
  // right node then bias the split to put more values on the left node.
  if (insert_position == start()) {
    dest->set_finish(dest->start() + finish() - 1);
  } else if (insert_position == kNodeSlots) {
    dest->set_finish(dest->start());
  } else {
    dest->set_finish(dest->start() + count() / 2);
  }
  set_finish(finish() - dest->count());
  assert(count() >= 1);

  // Move values from the left sibling to the right sibling.
  dest->transfer_n(dest->count(), dest->start(), finish(), this, alloc);

  // The split key is the largest value in the left sibling.
  --mutable_finish();
  parent()->emplace_value(position(), alloc, finish_slot());
  value_destroy(finish(), alloc);
  parent()->set_child_noupdate_position(position() + 1, dest);

  if (is_internal()) {
    for (field_type i = dest->start(), j = finish() + 1; i <= dest->finish();
         ++i, ++j) {
      assert(child(j) != nullptr);
      dest->init_child(i, child(j));
      clear_child(j);
    }
  }
}